

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O3

void __thiscall
icu_63::Normalizer2DataBuilder::writeDataFile
          (Normalizer2DataBuilder *this,char *filename,bool writeRemoved)

{
  short sVar1;
  undefined8 uVar2;
  MappingType MVar3;
  int iVar4;
  UBool UVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  FILE *__stream;
  Norm *pNVar10;
  UnicodeString *s1;
  UnicodeString *pUVar11;
  undefined8 extraout_RAX;
  byte bVar12;
  byte bVar13;
  MappingType MVar14;
  UnicodeString *s2;
  int32_t offset;
  MappingType MVar15;
  UChar32 UVar16;
  byte bVar17;
  UChar32 UVar18;
  UnicodeSetIterator ccIter;
  UnicodeSetIterator mIter;
  int local_e4;
  int local_e0;
  UnicodeSetIterator local_b8;
  UnicodeSetIterator local_70;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    writeDataFile();
    UnicodeSetIterator::~UnicodeSetIterator(&local_b8);
    _Unwind_Resume(extraout_RAX);
  }
  uVar2._0_1_ = this->unicodeVersion[0];
  uVar2._1_1_ = this->unicodeVersion[1];
  uVar2._2_1_ = this->unicodeVersion[2];
  uVar2._3_1_ = this->unicodeVersion[3];
  uVar2._4_4_ = *(undefined4 *)&this->field_0x27c;
  if ((int)uVar2 != 0) {
    u_versionToString_63(this->unicodeVersion,(char *)&local_b8);
    fprintf(__stream,"* Unicode %s\n\n",&local_b8);
  }
  UnicodeSetIterator::UnicodeSetIterator(&local_b8,(UnicodeSet *)this);
  local_e0 = -1;
  bVar6 = false;
  iVar9 = -1;
  bVar17 = 0;
  do {
    UVar5 = UnicodeSetIterator::next(&local_b8);
    UVar18 = local_b8.codepoint;
    UVar16 = 0x110000;
    bVar7 = true;
    if ((UVar5 == '\0') || (local_b8.codepoint == -1)) {
      bVar12 = 0;
    }
    else {
      pNVar10 = Norms::getNormRef(&this->norms,local_b8.codepoint);
      bVar12 = pNVar10->cc;
      bVar7 = false;
      UVar16 = UVar18;
    }
    bVar13 = bVar17;
    iVar4 = local_e0;
    if ((bVar12 != bVar17 || UVar16 != iVar9 + 1) && (bVar13 = bVar12, iVar4 = UVar16, bVar17 != 0))
    {
      if (local_e0 == iVar9) {
        fprintf(__stream,"%04lX:%d\n",(long)local_e0,(ulong)bVar17);
      }
      else {
        fprintf(__stream,"%04lX..%04lX:%d\n",(long)local_e0,(long)iVar9);
      }
      bVar6 = true;
    }
    local_e0 = iVar4;
    iVar9 = UVar16;
    bVar17 = bVar13;
  } while (!bVar7);
  if (bVar6) {
    fputs("\n",__stream);
  }
  UnicodeSetIterator::UnicodeSetIterator(&local_70,&(this->norms).mappingSet);
  local_e4 = -1;
  MVar15 = NONE;
  s2 = (UnicodeString *)0x0;
  iVar9 = -1;
  do {
    UVar5 = UnicodeSetIterator::next(&local_70);
    UVar18 = local_70.codepoint;
    if ((UVar5 == '\0') || (local_70.codepoint == -1)) {
      bVar6 = true;
      UVar18 = 0x110000;
LAB_001dea30:
      s1 = (UnicodeString *)0x0;
      MVar14 = NONE;
    }
    else {
      pNVar10 = Norms::getNorm(&this->norms,local_70.codepoint);
      if ((pNVar10 == (Norm *)0x0) || (MVar14 = pNVar10->mappingType, MVar14 == NONE)) {
        bVar6 = false;
        goto LAB_001dea30;
      }
      s1 = pNVar10->mapping;
      bVar6 = false;
    }
    if ((MVar14 != MVar15) ||
       (bVar7 = anon_unknown_1::equalStrings(s1,s2), pUVar11 = s2, MVar3 = MVar15, iVar4 = local_e4,
       !bVar7 || UVar18 != iVar9 + 1)) {
      pUVar11 = s1;
      MVar3 = MVar14;
      iVar4 = UVar18;
      if (writeRemoved) {
        if (MVar15 != NONE) {
LAB_001dea6f:
          if (local_e4 == iVar9) {
            fprintf(__stream,"%04lX%c",(long)local_e4,(ulong)(uint)(int)"?-=>"[MVar15]);
          }
          else {
            fprintf(__stream,"%04lX..%04lX%c",(long)local_e4,(long)iVar9,
                    (ulong)(uint)(int)"?-=>"[MVar15]);
          }
          if ((s2 != (UnicodeString *)0x0) &&
             (0x1f < (ushort)(s2->fUnion).fStackFields.fLengthAndFlags)) {
            uVar8 = UnicodeString::char32At(s2,0);
            fprintf(__stream,"%04lX",(long)(int)uVar8);
            offset = 2 - (uint)(uVar8 < 0x10000);
            sVar1 = (s2->fUnion).fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar9 = (s2->fUnion).fFields.fLength;
            }
            else {
              iVar9 = (int)sVar1 >> 5;
            }
            for (; offset < iVar9; offset = (offset - (uint)(uVar8 < 0x10000)) + 2) {
              uVar8 = UnicodeString::char32At(s2,offset);
              fprintf(__stream," %04lX",(long)(int)uVar8);
              sVar1 = (s2->fUnion).fStackFields.fLengthAndFlags;
              if (sVar1 < 0) {
                iVar9 = (s2->fUnion).fFields.fLength;
              }
              else {
                iVar9 = (int)sVar1 >> 5;
              }
            }
          }
          fputs("\n",__stream);
        }
      }
      else if (1 < (int)MVar15) goto LAB_001dea6f;
    }
    local_e4 = iVar4;
    MVar15 = MVar3;
    s2 = pUVar11;
    iVar9 = UVar18;
    if (bVar6) {
      fclose(__stream);
      UnicodeSetIterator::~UnicodeSetIterator(&local_70);
      UnicodeSetIterator::~UnicodeSetIterator(&local_b8);
      return;
    }
  } while( true );
}

Assistant:

void
Normalizer2DataBuilder::writeDataFile(const char *filename, bool writeRemoved) const {
    // Do not processData() before writing the input-syntax data file.
    FILE *f = fopen(filename, "w");
    if(f == nullptr) {
        fprintf(stderr, "gennorm2/writeDataFile() error: unable to create the output file %s\n",
                filename);
        exit(U_FILE_ACCESS_ERROR);
        return;
    }

    if(unicodeVersion[0] != 0 || unicodeVersion[1] != 0 ||
            unicodeVersion[2] != 0 || unicodeVersion[3] != 0) {
        char uv[U_MAX_VERSION_STRING_LENGTH];
        u_versionToString(unicodeVersion, uv);
        fprintf(f, "* Unicode %s\n\n", uv);
    }

    UnicodeSetIterator ccIter(norms.ccSet);
    UChar32 start = U_SENTINEL;
    UChar32 end = U_SENTINEL;
    uint8_t prevCC = 0;
    bool done = false;
    bool didWrite = false;
    do {
        UChar32 c;
        uint8_t cc;
        if(ccIter.next() && !ccIter.isString()) {
            c = ccIter.getCodepoint();
            cc = norms.getCC(c);
        } else {
            c = 0x110000;
            cc = 0;
            done = true;
        }
        if(cc == prevCC && c == (end + 1)) {
            end = c;
        } else {
            if(prevCC != 0) {
                if(start == end) {
                    fprintf(f, "%04lX:%d\n", (long)start, (int)prevCC);
                } else {
                    fprintf(f, "%04lX..%04lX:%d\n", (long)start, (long)end, (int)prevCC);
                }
                didWrite = true;
            }
            start = end = c;
            prevCC = cc;
        }
    } while(!done);
    if(didWrite) {
        fputs("\n", f);
    }

    UnicodeSetIterator mIter(norms.mappingSet);
    start = U_SENTINEL;
    end = U_SENTINEL;
    const UnicodeString *prevMapping = nullptr;
    Norm::MappingType prevType = Norm::NONE;
    done = false;
    do {
        UChar32 c;
        const Norm *norm;
        if(mIter.next() && !mIter.isString()) {
            c = mIter.getCodepoint();
            norm = norms.getNorm(c);
        } else {
            c = 0x110000;
            norm = nullptr;
            done = true;
        }
        const UnicodeString *mapping;
        Norm::MappingType type;
        if(norm == nullptr) {
            mapping = nullptr;
            type = Norm::NONE;
        } else {
            type = norm->mappingType;
            if(type == Norm::NONE) {
                mapping = nullptr;
            } else {
                mapping = norm->mapping;
            }
        }
        if(type == prevType && equalStrings(mapping, prevMapping) && c == (end + 1)) {
            end = c;
        } else {
            if(writeRemoved ? prevType != Norm::NONE : prevType > Norm::REMOVED) {
                if(start == end) {
                    fprintf(f, "%04lX%c", (long)start, typeChars[prevType]);
                } else {
                    fprintf(f, "%04lX..%04lX%c", (long)start, (long)end, typeChars[prevType]);
                }
                writeMapping(f, prevMapping);
            }
            start = end = c;
            prevMapping = mapping;
            prevType = type;
        }
    } while(!done);

    fclose(f);
}